

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

uint __thiscall
Inline::HandleDifferentTypesSameFunction
          (Inline *this,FixedFieldInfo *fixedFunctionInfoArray,uint16 cachedFixedInlineeCount)

{
  FixedFieldIDL *this_00;
  uint uVar1;
  intptr_t iVar2;
  intptr_t iVar3;
  int iVar4;
  undefined6 in_register_00000012;
  uint uVar5;
  ulong uVar6;
  FixedFieldIDL *this_01;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  undefined1 local_b8 [8];
  FixedFieldInfo tmpInfo;
  
  iVar4 = (int)CONCAT62(in_register_00000012,cachedFixedInlineeCount);
  if (iVar4 == 0) {
    uVar5 = 0;
  }
  else {
    uVar1 = 0;
    uVar7 = CONCAT62(in_register_00000012,cachedFixedInlineeCount) & 0xffffffff;
    do {
      uVar5 = uVar1 + 1;
      if ((ushort)uVar5 < cachedFixedInlineeCount) {
        uVar9 = (iVar4 + -1) - uVar1;
        tmpInfo.m_data.environmentAddr.ptr =
             (void *)((long)&(fixedFunctionInfoArray->m_data).valueType +
                     (ulong)((uVar1 & 0xffff) * 0x60));
        this_01 = (FixedFieldIDL *)
                  ((long)&(fixedFunctionInfoArray->m_data).valueType +
                  (ulong)((uVar5 & 0xffff) * 0x60));
        do {
          iVar2 = FixedFieldInfo::GetFieldValue
                            ((FixedFieldInfo *)tmpInfo.m_data.environmentAddr.ptr);
          iVar3 = FixedFieldInfo::GetFieldValue((FixedFieldInfo *)this_01);
          if (iVar2 == iVar3) {
            FixedFieldIDL::FixedFieldIDL((FixedFieldIDL *)local_b8,this_01);
            uVar6 = (ulong)((uVar5 & 0xffff) * 0x60);
            this_00 = (FixedFieldIDL *)((long)&(fixedFunctionInfoArray->m_data).valueType + uVar6);
            FixedFieldIDL::operator=(this_01,this_00);
            FixedFieldIDL::operator=(this_00,(FixedFieldIDL *)local_b8);
            FixedFieldInfo::SetNextHasSameFixedField
                      ((FixedFieldInfo *)
                       ((long)&fixedFunctionInfoArray[-1].m_data.valueType + uVar6));
            uVar5 = uVar5 + 1;
            uVar7 = (ulong)((int)uVar7 - 1);
          }
          this_01 = this_01 + 1;
          uVar8 = (short)uVar9 - 1;
          uVar9 = (uint)uVar8;
        } while (uVar8 != 0);
      }
      uVar1 = uVar5;
      uVar5 = (uint)uVar7;
    } while ((ushort)uVar1 < cachedFixedInlineeCount);
  }
  return uVar5 & 0xffff;
}

Assistant:

uint
Inline::HandleDifferentTypesSameFunction(__inout_ecount(cachedFixedInlineeCount) FixedFieldInfo* fixedFunctionInfoArray, uint16 cachedFixedInlineeCount)
{
    uint16 uniqueCount = cachedFixedInlineeCount;
    uint16 swapIndex;
    for (uint16 i = 0; i < cachedFixedInlineeCount; i++)
    {
        swapIndex = i+1;
        for (uint16 j = i+1; j < cachedFixedInlineeCount; j++)
        {
            if (fixedFunctionInfoArray[i].GetFieldValue() == fixedFunctionInfoArray[j].GetFieldValue())
            {
                FixedFieldInfo tmpInfo = fixedFunctionInfoArray[j];
                fixedFunctionInfoArray[j] = fixedFunctionInfoArray[swapIndex];
                fixedFunctionInfoArray[swapIndex] = tmpInfo;
                fixedFunctionInfoArray[swapIndex - 1].SetNextHasSameFixedField();
                swapIndex++;
                uniqueCount--;
            }
        }
        i = swapIndex-1;
    }
    return uniqueCount;
}